

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffie-hellman.c
# Opt level: O1

void dh_cleanup(dh_ctx *ctx)

{
  if (ctx->x != (mp_int *)0x0) {
    mp_free(ctx->x);
  }
  if (ctx->e != (mp_int *)0x0) {
    mp_free(ctx->e);
  }
  if (ctx->p != (mp_int *)0x0) {
    mp_free(ctx->p);
  }
  if (ctx->g != (mp_int *)0x0) {
    mp_free(ctx->g);
  }
  if (ctx->q != (mp_int *)0x0) {
    mp_free(ctx->q);
  }
  safefree(ctx);
  return;
}

Assistant:

void dh_cleanup(dh_ctx *ctx)
{
    if (ctx->x)
        mp_free(ctx->x);
    if (ctx->e)
        mp_free(ctx->e);
    if (ctx->p)
        mp_free(ctx->p);
    if (ctx->g)
        mp_free(ctx->g);
    if (ctx->q)
        mp_free(ctx->q);
    sfree(ctx);
}